

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int eval_path_expr(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                  lyxp_set *set,int options)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  lys_node *node;
  char *pcVar4;
  LY_ERR *pLVar5;
  long lVar6;
  lyxp_set *plVar7;
  lyxp_node_type local_48;
  lyxp_node_type local_44;
  int iStack_40;
  lyxp_node_type root_type;
  lys_module *local_38;
  
  uVar2 = *exp_idx;
  local_38 = param_4;
  switch(exp->tokens[uVar2]) {
  case LYXP_TOKEN_PAR1:
    if ('\x02' < ly_log_level) {
      pcVar4 = "parsed";
      if (set == (lyxp_set *)0x0) {
        pcVar4 = "skipped";
      }
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_path_expr",pcVar4,"(",
                 (ulong)exp->expr_pos[uVar2]);
      uVar2 = *exp_idx;
    }
    *exp_idx = uVar2 + 1;
    iVar3 = eval_expr(exp,exp_idx,cur_node,local_38,set,options);
    if (iVar3 != 0) {
      return iVar3;
    }
    if ('\x02' < ly_log_level) {
      _iStack_40 = "parsed";
      if (set == (lyxp_set *)0x0) {
        _iStack_40 = "skipped";
      }
      pcVar4 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_path_expr",_iStack_40,pcVar4,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
    break;
  default:
    pcVar4 = print_token(exp->tokens[uVar2]);
    ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar4,exp->expr + exp->expr_pos[*exp_idx]);
    return -1;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    goto switchD_00169c04_caseD_5;
  case LYXP_TOKEN_FUNCNAME:
    plVar7 = set;
    if (set != (lyxp_set *)0x0 && (options & 0x1cU) == 0) goto LAB_0016a128;
    if (set != (lyxp_set *)0x0) {
      if (exp->tok_len[uVar2] == '\x05') {
        iVar3 = strncmp(exp->expr + exp->expr_pos[uVar2],"deref",5);
        if (iVar3 == 0) goto LAB_0016a128;
      }
      else if ((exp->tok_len[uVar2] == '\a') &&
              (iVar3 = strncmp(exp->expr + exp->expr_pos[uVar2],"current",7), iVar3 == 0)) {
        xpath_current((lyxp_set **)0x0,0,cur_node,local_38,set,options);
        goto LAB_0016a119;
      }
      uVar1 = set->used;
      if ((ulong)uVar1 != 0) {
        lVar6 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar6) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar6) = 0;
          }
          lVar6 = lVar6 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar6);
      }
    }
LAB_0016a119:
    plVar7 = (lyxp_set *)0x0;
LAB_0016a128:
    iVar3 = eval_function_call(exp,exp_idx,cur_node,local_38,plVar7,options);
    goto LAB_0016a130;
  case LYXP_TOKEN_OPERATOR_PATH:
    if (set != (lyxp_set *)0x0) {
      if ((options & 0x1cU) == 0) {
        _iStack_40 = (char *)moveto_get_root(cur_node,options,&local_44);
        lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,(lys_module *)0x0,options);
        if ((lyd_node *)_iStack_40 != (lyd_node *)0x0) {
          set_insert_node(set,_iStack_40,0,local_44,0);
        }
      }
      else if (cur_node == (lyd_node *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,0x10cd);
      }
      else {
        node = moveto_snode_get_root((lys_node *)cur_node,options,&local_48);
        uVar1 = set->used;
        if ((ulong)uVar1 != 0) {
          lVar6 = 0;
          do {
            if (*(int *)((long)&((set->val).nodes)->pos + lVar6) == 1) {
              *(undefined4 *)((long)&((set->val).nodes)->pos + lVar6) = 0;
            }
            lVar6 = lVar6 + 0x10;
          } while ((ulong)uVar1 << 4 != lVar6);
        }
        set_snode_insert_node(set,node,local_48);
      }
    }
    uVar2 = *exp_idx;
    if (exp->tok_len[uVar2] != '\x01') {
      if ('\x02' < ly_log_level) {
        _iStack_40 = "parsed";
        if (set == (lyxp_set *)0x0) {
          _iStack_40 = "skipped";
        }
        pcVar4 = print_token(exp->tokens[uVar2]);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_absolute_location_path",_iStack_40,pcVar4,
                   (ulong)exp->expr_pos[*exp_idx]);
        uVar2 = *exp_idx;
      }
      *exp_idx = uVar2 + 1;
      iVar3 = 1;
      goto LAB_00169c19;
    }
    if ('\x02' < ly_log_level) {
      _iStack_40 = "parsed";
      if (set == (lyxp_set *)0x0) {
        _iStack_40 = "skipped";
      }
      pcVar4 = print_token(exp->tokens[uVar2]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_absolute_location_path",_iStack_40,pcVar4,
                 (ulong)exp->expr_pos[*exp_idx]);
      uVar2 = *exp_idx;
    }
    uVar2 = uVar2 + 1;
    *exp_idx = uVar2;
    if (exp->used == uVar2) {
      return 0;
    }
    if (LYXP_TOKEN_NODETYPE < exp->tokens[uVar2]) {
      return 0;
    }
    if ((0x6e0U >> (exp->tokens[uVar2] & (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1) ==
        0) {
      return 0;
    }
    goto switchD_00169c04_caseD_5;
  case LYXP_TOKEN_LITERAL:
    plVar7 = set;
    if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
      if ((set != (lyxp_set *)0x0) && (uVar1 = set->used, (ulong)uVar1 != 0)) {
        lVar6 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar6) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar6) = 0;
          }
          lVar6 = lVar6 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar6);
      }
      plVar7 = (lyxp_set *)0x0;
    }
    eval_literal(exp,exp_idx,plVar7);
    break;
  case LYXP_TOKEN_NUMBER:
    plVar7 = set;
    if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
      if ((set != (lyxp_set *)0x0) && (uVar1 = set->used, (ulong)uVar1 != 0)) {
        lVar6 = 0;
        do {
          if (*(int *)((long)&((set->val).nodes)->pos + lVar6) == 1) {
            *(undefined4 *)((long)&((set->val).nodes)->pos + lVar6) = 0;
          }
          lVar6 = lVar6 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar6);
      }
      plVar7 = (lyxp_set *)0x0;
    }
    iVar3 = eval_number(exp,exp_idx,plVar7);
    if (iVar3 != 0) {
      return -1;
    }
  }
  while( true ) {
    uVar2 = *exp_idx;
    if (exp->used <= uVar2) {
      return 0;
    }
    if (exp->tokens[uVar2] != LYXP_TOKEN_BRACK1) break;
    iVar3 = eval_predicate(exp,exp_idx,cur_node,local_38,set,options);
LAB_0016a130:
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  if (exp->tokens[uVar2] != LYXP_TOKEN_OPERATOR_PATH) {
    return 0;
  }
  iVar3 = 0;
  if (exp->tok_len[uVar2] != '\x01') {
    if (exp->tok_len[uVar2] != '\x02') {
      __assert_fail("exp->tok_len[*exp_idx] == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                    ,0x19d6,
                    "int eval_path_expr(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    iVar3 = 1;
  }
  if ('\x02' < ly_log_level) {
    pcVar4 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar4 = "skipped";
    }
    _iStack_40 = (char *)CONCAT44(root_type,iVar3);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_path_expr",pcVar4,"Operator(Path)",
               (ulong)exp->expr_pos[uVar2]);
    uVar2 = *exp_idx;
    iVar3 = iStack_40;
  }
  *exp_idx = uVar2 + 1;
LAB_00169c19:
  iVar3 = eval_relative_location_path(exp,exp_idx,cur_node,local_38,iVar3,set,options);
  if (iVar3 == 0) {
    return 0;
  }
  return iVar3;
switchD_00169c04_caseD_5:
  iVar3 = 0;
  goto LAB_00169c19;
}

Assistant:

static int
eval_path_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
               struct lyxp_set *set, int options)
{
    int all_desc, ret;

    switch (exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' */

        /* '(' */
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        /* Expr */
        ret = eval_expr(exp, exp_idx, cur_node, local_mod, set, options);
        if (ret) {
            return ret;
        }

        /* ')' */
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        goto predicate;

    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        ret = eval_relative_location_path(exp, exp_idx, cur_node, local_mod, 0, set, options);
        if (ret) {
            return ret;
        }
        break;

    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        if (!set || (options & LYXP_SNODE_ALL)) {
            if (set) {
                /* the only function returning node-set - thus relevant */
                if ((exp->tok_len[*exp_idx] == 7) && !strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "current", 7)) {
                    xpath_current(NULL, 0, cur_node, local_mod, set, options);
                } else if ((exp->tok_len[*exp_idx] == 5) && !strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "deref", 5)) {
                    ret = eval_function_call(exp, exp_idx, cur_node, local_mod, set, options);
                    if (ret) {
                        return ret;
                    }
                    goto predicate;
                } else {
                    set_snode_clear_ctx(set);
                }
            }
            ret = eval_function_call(exp, exp_idx, cur_node, local_mod, NULL, options);
        } else {
            ret = eval_function_call(exp, exp_idx, cur_node, local_mod, set, options);
        }
        if (ret) {
            return ret;
        }

        goto predicate;

    case LYXP_TOKEN_OPERATOR_PATH:
        /* AbsoluteLocationPath */
        ret = eval_absolute_location_path(exp, exp_idx, cur_node, local_mod, set, options);
        if (ret) {
            return ret;
        }
        break;

    case LYXP_TOKEN_LITERAL:
        /* Literal */
        if (!set || (options & LYXP_SNODE_ALL)) {
            if (set) {
                set_snode_clear_ctx(set);
            }
            eval_literal(exp, exp_idx, NULL);
        } else {
            eval_literal(exp, exp_idx, set);
        }

        goto predicate;

    case LYXP_TOKEN_NUMBER:
        /* Number */
        if (!set || (options & LYXP_SNODE_ALL)) {
            if (set) {
                set_snode_clear_ctx(set);
            }
            ret = eval_number(exp, exp_idx, NULL);
        } else {
            ret = eval_number(exp, exp_idx, set);
        }
        if (ret) {
            return ret;
        }

        goto predicate;

    default:
        LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
               print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
        return -1;
    }

    return EXIT_SUCCESS;

predicate:
    /* Predicate* */
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
        ret = eval_predicate(exp, exp_idx, cur_node, local_mod, set, options);
        if (ret) {
            return ret;
        }
    }

    /* ('/' or '//') RelativeLocationPath */
    if ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH)) {

        /* evaluate '/' or '//' */
        if (exp->tok_len[*exp_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*exp_idx] == 2);
            all_desc = 1;
        }

        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        ret = eval_relative_location_path(exp, exp_idx, cur_node, local_mod, all_desc, set, options);
        if (ret) {
            return ret;
        }
    }

    return EXIT_SUCCESS;
}